

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<unsigned_int> __thiscall wasm::WATParser::Lexer::takeAlign(Lexer *this)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  uint *puVar4;
  size_type sVar5;
  char *in_RCX;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  _Optional_payload_base<unsigned_int> local_114;
  optional<unsigned_int> o;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  string_view local_d0;
  undefined1 local_c0 [8];
  Lexer subLexer;
  anon_unknown_0 *local_40;
  char *local_38;
  undefined1 local_30 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  sVar6 = next(this);
  local_40 = (anon_unknown_0 *)sVar6._M_len;
  local_38 = sVar6._M_str;
  sVar6._M_str = in_RCX;
  sVar6._M_len = (size_t)local_38;
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30,local_40,sVar6)
  ;
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
  if (bVar1) {
    pbVar3 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30)->
              span;
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(pbVar3,0,6);
    __y = sv("align=",6);
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)this_local;
    }
    pbVar3 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30)->
              span;
    local_d0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (pbVar3,6,0xffffffffffffffff);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    Lexer((Lexer *)local_c0,local_d0,&local_f8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_f8);
    local_114 = (_Optional_payload_base<unsigned_int>)takeU32((Lexer *)local_c0);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_114);
    if (bVar1) {
      puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_114);
      iVar2 = Bits::popCount(*puVar4);
      if (iVar2 == 1) {
        pbVar3 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::operator->
                            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_30
                            )->span;
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar3);
        this->pos = this->pos + sVar5;
        advance(this);
        this_local = (Lexer *)local_114;
        bVar1 = true;
      }
      else {
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
    }
    ~Lexer((Lexer *)local_c0);
    if (bVar1) {
      return (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)this_local;
    }
  }
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<uint32_t> Lexer::takeAlign() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 6) != "align="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(6));
    if (auto o = subLexer.takeU32()) {
      if (Bits::popCount(*o) != 1) {
        return std::nullopt;
      }
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}